

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexNoise.cpp
# Opt level: O1

float __thiscall SimplexNoise::fractal(SimplexNoise *this,size_t octaves,float x,float y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (octaves != 0) {
    fVar5 = this->mFrequency;
    fVar6 = this->mAmplitude;
    fVar1 = this->mLacunarity;
    fVar2 = this->mPersistence;
    fVar3 = 0.0;
    do {
      fVar4 = noise(fVar5 * x,fVar5 * y);
      fVar3 = fVar3 + fVar4 * fVar6;
      fVar5 = fVar5 * fVar1;
      fVar6 = fVar6 * fVar2;
      octaves = octaves - 1;
    } while (octaves != 0);
    return fVar3;
  }
  return 0.0;
}

Assistant:

float SimplexNoise::fractal(size_t octaves, float x, float y) const {
    float output = 0.f;
    float frequency = mFrequency;
    float amplitude = mAmplitude;

    for (size_t i = 0; i < octaves; i++) {
        output += (amplitude * noise(x * frequency, y * frequency));

        frequency *= mLacunarity;
        amplitude *= mPersistence;
    }

    return output;
}